

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::create_color_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  color_quad_u8 *pcVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  endpoint_indices_details *peVar9;
  color_cluster *pcVar10;
  color_quad_u8 (*pacVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  uint s;
  uint uVar17;
  long lVar18;
  int *piVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  uint s_1;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint E4 [8] [16];
  uint E8 [4] [256];
  int local_1338 [192];
  int local_1038 [256];
  int aiStack_c38 [256];
  int aiStack_838 [256];
  int aiStack_438 [258];
  
  uVar24 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar22 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar24;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar22 * data;
  uVar24 = ((data + 1) * uVar22) / uVar24;
  if (SUB164(auVar13 / auVar12,0) < (uint)uVar24) {
    uVar22 = SUB168(auVar13 / auVar12,0) & 0xffffffff;
    do {
      peVar9 = (this->m_endpoint_indices).m_p;
      uVar7 = peVar9[uVar22].field_0.field_0.color;
      pcVar10 = (this->m_color_clusters).m_p;
      bVar3 = this->m_has_subblocks;
      bVar4 = (this->m_params).m_perceptual;
      pacVar11 = this->m_blocks;
      piVar19 = local_1338;
      uVar25 = 0;
      do {
        pcVar1 = pacVar11[uVar22] + uVar25;
        lVar18 = 0;
        do {
          if (bVar3 == false) {
            bVar5 = (pcVar1->field_0).field_0.b;
            iVar23 = (uint)(pcVar1->field_0).field_0.r -
                     (uint)pcVar10[uVar7].color_values[lVar18].field_0.field_0.r;
            iVar29 = (uint)(pcVar1->field_0).field_0.g -
                     (uint)pcVar10[uVar7].color_values[lVar18].field_0.field_0.g;
            bVar6 = pcVar10[uVar7].color_values[lVar18].field_0.field_0.b;
          }
          else {
            uVar8 = peVar9[((uint)(uVar25 >> 3) & 0x1fffffff) + (int)uVar22 * 2].field_0.field_0.
                    color;
            bVar5 = (pcVar1->field_0).field_0.b;
            iVar23 = (uint)(pcVar1->field_0).field_0.r -
                     (uint)pcVar10[uVar8].color_values[lVar18].field_0.field_0.r;
            iVar29 = (uint)(pcVar1->field_0).field_0.g -
                     (uint)pcVar10[uVar8].color_values[lVar18].field_0.field_0.g;
            bVar6 = pcVar10[uVar8].color_values[lVar18].field_0.field_0.b;
          }
          iVar21 = (uint)bVar5 - (uint)bVar6;
          if ((bVar4 & 1U) == 0) {
            iVar23 = iVar21 * iVar21 + iVar29 * iVar29 + iVar23 * iVar23;
          }
          else {
            iVar23 = iVar21 * iVar21 + iVar29 * iVar29 * 0x19 + iVar23 * iVar23 * 8;
          }
          piVar19[lVar18] = iVar23;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
        uVar25 = uVar25 + 1;
        piVar19 = piVar19 + 4;
      } while (uVar25 != 0x10);
      piVar19 = local_1338 + 0x40;
      lVar18 = 0;
      do {
        lVar26 = 0;
        do {
          piVar19[lVar26] =
               *(int *)((long)local_1338 +
                       (ulong)((uint)lVar26 & 0xfffffffc) + (lVar18 * 2 + 1) * 0x10) +
               local_1338[lVar18 * 8 + (ulong)((uint)lVar26 & 3)];
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x10);
        lVar18 = lVar18 + 1;
        piVar19 = piVar19 + 0x10;
      } while (lVar18 != 8);
      piVar19 = local_1038;
      lVar18 = 0;
      do {
        uVar25 = 0;
        do {
          piVar19[uVar25] =
               local_1338[(lVar18 * 2 + 1) * 0x10 + (uVar25 >> 4 & 0xfffffff) + 0x40] +
               local_1338[lVar18 * 0x20 + (ulong)((uint)uVar25 & 0xf) + 0x40];
          uVar25 = uVar25 + 1;
        } while (uVar25 != 0x100);
        lVar18 = lVar18 + 1;
        piVar19 = piVar19 + 0x100;
      } while (lVar18 != 4);
      uVar25 = (ulong)(this->m_color_selectors).m_size;
      if (uVar25 == 0) {
        uVar17 = 0;
      }
      else {
        uVar27 = 0;
        uVar28 = 0xffffffff;
        uVar20 = 0;
        do {
          uVar17 = (this->m_color_selectors).m_p[uVar27];
          uVar30 = aiStack_c38[uVar17 >> 8 & 0xff] + local_1038[uVar17 & 0xff] +
                   *(int *)((long)aiStack_838 + (ulong)(uVar17 >> 0xe & 0x3fc)) +
                   aiStack_438[uVar17 >> 0x18];
          if (uVar30 < uVar28) {
            uVar20 = uVar27 & 0xffffffff;
          }
          uVar17 = (uint)uVar20;
          if (uVar30 < uVar28) {
            uVar28 = uVar30;
          }
          uVar27 = uVar27 + 1;
        } while (uVar25 != uVar27);
      }
      lVar18 = (ulong)uVar17 * 0x104 + *pData_ptr;
      lVar26 = 0;
      do {
        piVar19 = (int *)(lVar18 + lVar26);
        iVar23 = piVar19[1];
        iVar29 = piVar19[2];
        iVar21 = piVar19[3];
        iVar14 = *(int *)((long)local_1338 + lVar26 + 4);
        iVar15 = *(int *)((long)local_1338 + lVar26 + 8);
        iVar16 = *(int *)((long)local_1338 + lVar26 + 0xc);
        piVar2 = (int *)(lVar18 + lVar26);
        *piVar2 = *piVar19 + *(int *)((long)local_1338 + lVar26);
        piVar2[1] = iVar23 + iVar14;
        piVar2[2] = iVar29 + iVar15;
        piVar2[3] = iVar21 + iVar16;
        lVar26 = lVar26 + 0x10;
      } while (lVar26 != 0x100);
      *(undefined1 *)(lVar18 + 0x100) = 1;
      (this->m_selector_indices).m_p[(uint)((int)uVar22 << (bVar3 & 0x1fU))].field_0.field_0.color =
           (uint16)uVar17;
      uVar22 = uVar22 + 1;
    } while (uVar22 < (uVar24 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook_task(uint64 data, void* pData_ptr)
    {
        crnlib::vector<color_selector_details>& selector_details = *static_cast<crnlib::vector<color_selector_details>*>(pData_ptr);
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint E2[16][4];
        uint E4[8][16];
        uint E8[4][256];
        for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++)
        {
            color_cluster& cluster = m_color_clusters[m_endpoint_indices[b].color];
            color_quad_u8* endpoint_colors = cluster.color_values;
            for (uint p = 0; p < 16; p++)
            {
                for (uint s = 0; s < 4; s++)
                {
                    E2[p][s] = m_has_subblocks ? color::color_distance(m_params.m_perceptual, m_blocks[b][p], m_color_clusters[m_endpoint_indices[b << 1 | p >> 3].color].color_values[s], false) : color::color_distance(m_params.m_perceptual, m_blocks[b][p], endpoint_colors[s], false);
                }
            }
            for (uint p = 0; p < 8; p++)
            {
                for (uint s = 0; s < 16; s++)
                {
                    E4[p][s] = E2[p << 1][s & 3] + E2[p << 1 | 1][s >> 2];
                }
            }
            for (uint p = 0; p < 4; p++)
            {
                for (uint s = 0; s < 256; s++)
                {
                    E8[p][s] = E4[p << 1][s & 15] + E4[p << 1 | 1][s >> 4];
                }
            }
            uint best_index = 0;
            for (uint best_error = cUINT32_MAX, s = 0; s < m_color_selectors.size(); s++)
            {
                uint32 selector = m_color_selectors[s];
                uint error = E8[0][selector & 255] + E8[1][selector >> 8 & 255] + E8[2][selector >> 16 & 255] + E8[3][selector >> 24 & 255];
                if (error < best_error)
                {
                    best_error = error;
                    best_index = s;
                }
            }
            uint(&total_errors)[16][4] = selector_details[best_index].error;
            for (uint p = 0; p < 16; p++)
            {
                for (uint s = 0; s < 4; s++)
                {
                    total_errors[p][s] += E2[p][s];
                }
            }
            selector_details[best_index].used = true;
            m_selector_indices[m_has_subblocks ? b << 1 : b].color = best_index;
        }
    }